

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O1

void __thiscall
ConvexDecomposition::CTri::addWeighted
          (CTri *this,WpointVector *list,ConvexDecompInterface *callback)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Wpoint p6;
  Wpoint p5;
  Wpoint p4;
  Wpoint p3;
  Wpoint p2;
  Wpoint p1;
  value_type local_90;
  value_type local_80;
  value_type local_70;
  value_type local_60;
  value_type local_50;
  value_type local_40;
  
  local_40.mPoint.x = (this->mP1).x;
  local_70.mWeight = this->mC1;
  local_40.mPoint.y = (this->mP1).y;
  local_40.mPoint.z = (this->mP1).z;
  local_50.mPoint.x = (this->mP2).x;
  local_80.mWeight = this->mC2;
  local_50.mPoint.y = (this->mP2).y;
  local_50.mPoint.z = (this->mP2).z;
  local_60.mPoint.x = (this->mP3).x;
  local_90.mWeight = this->mC3;
  local_60.mPoint.y = (this->mP3).y;
  local_60.mPoint.z = (this->mP3).z;
  auVar1 = vsubss_avx512f(ZEXT416((uint)(this->mNear2).y),ZEXT416((uint)local_50.mPoint.y));
  auVar2 = vsubss_avx512f(ZEXT416((uint)(this->mNear2).z),ZEXT416((uint)local_50.mPoint.z));
  auVar3 = vsubss_avx512f(ZEXT416((uint)(this->mNear3).x),ZEXT416((uint)local_60.mPoint.x));
  auVar4 = vsubss_avx512f(ZEXT416((uint)(this->mNear3).y),ZEXT416((uint)local_60.mPoint.y));
  auVar5 = vsubss_avx512f(ZEXT416((uint)(this->mNear3).z),ZEXT416((uint)local_60.mPoint.z));
  auVar6 = vmulss_avx512f(ZEXT416((uint)((this->mNear1).x - local_40.mPoint.x)),ZEXT416(0x40800000))
  ;
  auVar7 = vmulss_avx512f(ZEXT416((uint)((this->mNear1).y - local_40.mPoint.y)),ZEXT416(0x40800000))
  ;
  auVar10 = ZEXT416(0x40800000);
  auVar8 = vmulss_avx512f(ZEXT416((uint)((this->mNear1).z - local_40.mPoint.z)),auVar10);
  auVar9 = vmulss_avx512f(ZEXT416((uint)((this->mNear2).x - local_50.mPoint.x)),auVar10);
  auVar1 = vmulss_avx512f(auVar1,auVar10);
  auVar2 = vmulss_avx512f(auVar2,auVar10);
  auVar10 = ZEXT416(0x40800000);
  auVar3 = vmulss_avx512f(auVar3,auVar10);
  auVar4 = vmulss_avx512f(auVar4,auVar10);
  auVar5 = vmulss_avx512f(auVar5,auVar10);
  local_70.mPoint.x = auVar6._0_4_ + local_40.mPoint.x;
  local_70.mPoint.y = auVar7._0_4_ + local_40.mPoint.y;
  local_70.mPoint.z = auVar8._0_4_ + local_40.mPoint.z;
  local_80.mPoint.x = auVar9._0_4_ + local_50.mPoint.x;
  auVar1 = vaddss_avx512f(ZEXT416((uint)local_50.mPoint.y),auVar1);
  auVar2 = vaddss_avx512f(ZEXT416((uint)local_50.mPoint.z),auVar2);
  auVar3 = vaddss_avx512f(ZEXT416((uint)local_60.mPoint.x),auVar3);
  auVar4 = vaddss_avx512f(ZEXT416((uint)local_60.mPoint.y),auVar4);
  auVar5 = vaddss_avx512f(ZEXT416((uint)local_60.mPoint.z),auVar5);
  local_80.mPoint.y = auVar1._0_4_;
  local_80.mPoint.z = auVar2._0_4_;
  local_90.mPoint.x = auVar3._0_4_;
  local_90.mPoint.y = auVar4._0_4_;
  local_90.mPoint.z = auVar5._0_4_;
  local_60.mWeight = local_90.mWeight;
  local_50.mWeight = local_80.mWeight;
  local_40.mWeight = local_70.mWeight;
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_40);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_50);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_60);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_70);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_80);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_90);
  return;
}

Assistant:

void addWeighted(WpointVector &list,ConvexDecompInterface *callback)
  {

    Wpoint p1(mP1,mC1);
    Wpoint p2(mP2,mC2);
    Wpoint p3(mP3,mC3);

		Vector3d d1 = mNear1 - mP1;
		Vector3d d2 = mNear2 - mP2;
		Vector3d d3 = mNear3 - mP3;

		d1*=WSCALE;
		d2*=WSCALE;
		d3*=WSCALE;

		d1 = d1 + mP1;
		d2 = d2 + mP2;
 	  d3 = d3 + mP3;

    Wpoint p4(d1,mC1);
    Wpoint p5(d2,mC2);
    Wpoint p6(d3,mC3);

    list.push_back(p1);
    list.push_back(p2);
    list.push_back(p3);

    list.push_back(p4);
    list.push_back(p5);
    list.push_back(p6);

#if 0
		callback->ConvexDebugPoint(mP1.Ptr(),0.01f,0x00FF00);
		callback->ConvexDebugPoint(mP2.Ptr(),0.01f,0x00FF00);
		callback->ConvexDebugPoint(mP3.Ptr(),0.01f,0x00FF00);
		callback->ConvexDebugPoint(d1.Ptr(),0.01f,0xFF0000);
		callback->ConvexDebugPoint(d2.Ptr(),0.01f,0xFF0000);
		callback->ConvexDebugPoint(d3.Ptr(),0.01f,0xFF0000);

		callback->ConvexDebugTri(mP1.Ptr(), d1.Ptr(),  d1.Ptr(),0x00FF00);
		callback->ConvexDebugTri(mP2.Ptr(), d2.Ptr(),  d2.Ptr(),0x00FF00);
		callback->ConvexDebugTri(mP3.Ptr(), d3.Ptr(),  d3.Ptr(),0x00FF00);

		Vector3d np1 = mP1 + mNormal*0.05f;
		Vector3d np2 = mP2 + mNormal*0.05f;
		Vector3d np3 = mP3 + mNormal*0.05f;

		callback->ConvexDebugTri(mP1.Ptr(), np1.Ptr(), np1.Ptr(), 0xFF00FF );
		callback->ConvexDebugTri(mP2.Ptr(), np2.Ptr(), np2.Ptr(), 0xFF00FF );
		callback->ConvexDebugTri(mP3.Ptr(), np3.Ptr(), np3.Ptr(), 0xFF00FF );

		callback->ConvexDebugPoint( np1.Ptr(), 0.01F, 0XFF00FF );
		callback->ConvexDebugPoint( np2.Ptr(), 0.01F, 0XFF00FF );
		callback->ConvexDebugPoint( np3.Ptr(), 0.01F, 0XFF00FF );

#endif



  }